

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float32 float32_rem_arm(float32 a,float32 b,float_status *status)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float32 fVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  
  uVar12 = (ulong)a;
  if ((status->flush_inputs_to_zero != '\0') && ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    uVar12 = (ulong)(a & 0x80000000);
  }
  fVar6 = (float32)uVar12;
  if ((status->flush_inputs_to_zero != '\0') && ((b & 0x7fffff) != 0 && (b & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    b = b & 0x80000000;
  }
  uVar13 = fVar6 & 0x7fffff;
  uVar16 = (uint)(uVar12 >> 0x17) & 0xff;
  uVar20 = b & 0x7fffff;
  uVar8 = b >> 0x17;
  uVar11 = uVar8 & 0xff;
  if (uVar16 != 0xff) {
    if ((char)uVar8 == '\0') {
      if (uVar20 == 0) goto LAB_0055b322;
      uVar8 = 0x1f;
      if (uVar20 != 0) {
        for (; uVar20 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar20 = uVar20 << ((char)(uVar8 ^ 0x1f) - 8U & 0x1f);
      uVar11 = 9 - (uVar8 ^ 0x1f);
    }
    else if ((uVar8 & 0xff) == 0xff) {
      if (uVar20 == 0) {
        return fVar6;
      }
      goto LAB_0055b261;
    }
    if ((uVar12 >> 0x17 & 0xff) == 0) {
      if ((uVar12 & 0x7fffff) == 0) {
        return fVar6;
      }
      uVar8 = 0x1f;
      if ((uVar12 & 0x7fffff) != 0) {
        for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar13 = uVar13 << ((char)(uVar8 ^ 0x1f) - 8U & 0x1f);
      uVar16 = 9 - (uVar8 ^ 0x1f);
    }
    iVar17 = uVar16 - uVar11;
    uVar13 = uVar13 | 0x800000;
    uVar20 = uVar20 | 0x800000;
    if (iVar17 < 0x20) {
      uVar13 = uVar13 << 8;
      if (iVar17 < 0) {
        if (iVar17 != -1) {
          return fVar6;
        }
        uVar13 = uVar13 >> 1;
      }
      uVar20 = uVar20 << 8;
      uVar8 = 0;
      if (uVar20 <= uVar13) {
        uVar8 = uVar20;
      }
      uVar8 = uVar13 - uVar8;
      if (iVar17 < 1) {
        uVar13 = (uint)(uVar20 <= uVar13);
        uVar8 = uVar8 >> 2;
      }
      else {
        uVar13 = SUB164((ZEXT416(uVar8) << 0x20) / ZEXT416(uVar20),0) >> (-(char)iVar17 & 0x1fU);
        uVar8 = ((uVar8 >> 1) << ((char)iVar17 - 1U & 0x1f)) - uVar13 * (uVar20 >> 2);
      }
      uVar20 = uVar20 >> 2;
    }
    else {
      uVar8 = 0;
      if (uVar20 <= uVar13) {
        uVar8 = uVar20;
      }
      uVar9 = 0xffffffff;
      uVar14 = (ulong)(uVar13 - uVar8) << 0x28;
      uVar10 = (ulong)uVar20 << 0x28;
      iVar18 = iVar17 + -0x40;
      if (0x40 < iVar17) {
        uVar21 = uVar10 >> 0x20;
        iVar17 = iVar18;
        do {
          uVar7 = 0xffffffffffffffff;
          if (uVar14 < uVar10) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = uVar21;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = uVar14;
            uVar19 = SUB168(auVar4 / auVar2,0) << 0x20;
            for (lVar15 = uVar14 - SUB164(auVar4 / auVar2,0) * uVar21; lVar15 < 0;
                lVar15 = lVar15 + uVar21) {
              uVar19 = uVar19 - 0x100000000;
            }
            uVar7 = 0xffffffff;
            if ((ulong)(lVar15 << 0x20) < uVar10) {
              uVar7 = (ulong)(lVar15 << 0x20) / uVar21;
            }
            uVar7 = uVar7 | uVar19;
          }
          lVar15 = 0;
          if (1 < uVar7) {
            lVar15 = uVar7 - 2;
          }
          uVar14 = lVar15 * -((ulong)uVar20 << 0x26);
          iVar18 = iVar17 + -0x3e;
          bVar1 = 0x3e < iVar17;
          iVar17 = iVar18;
        } while (bVar1);
      }
      uVar21 = 0xffffffffffffffff;
      if (uVar14 < uVar10) {
        uVar7 = uVar10 >> 0x20;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar7;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar14;
        uVar21 = SUB168(auVar5 / auVar3,0) << 0x20;
        for (lVar15 = uVar14 - SUB164(auVar5 / auVar3,0) * uVar7; lVar15 < 0;
            lVar15 = lVar15 + uVar7) {
          uVar21 = uVar21 - 0x100000000;
        }
        if ((ulong)(lVar15 << 0x20) < uVar10) {
          uVar9 = (ulong)(lVar15 << 0x20) / uVar7;
        }
        uVar21 = uVar9 | uVar21;
      }
      uVar9 = 0;
      if (1 < uVar21) {
        uVar9 = uVar21 - 2;
      }
      uVar20 = uVar20 * 0x40;
      uVar13 = (uint)(uVar9 >> (-(char)iVar18 & 0x3fU));
      uVar8 = (int)((uVar14 >> 0x21) << ((char)iVar18 + 0x3fU & 0x3f)) - uVar20 * uVar13;
    }
    uVar16 = uVar8 * -2;
    uVar13 = uVar13 - 1;
    do {
      uVar16 = uVar16 + uVar20 * 2;
      uVar13 = uVar13 + 1;
      uVar8 = uVar8 - uVar20;
    } while (-1 < (int)uVar8);
    if (((int)(uVar20 - uVar16) < 0) || ((uVar20 == uVar16 && ((uVar13 & 1) == 0)))) {
      uVar8 = uVar20 + uVar8;
    }
    uVar13 = -uVar8;
    if (0 < (int)uVar8) {
      uVar13 = uVar8;
    }
    if (uVar13 == 0) {
      uVar16 = 0x20;
    }
    else {
      uVar16 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar16 = uVar16 ^ 0x1f;
    }
    fVar6 = roundAndPackFloat32((byte)((byte)(uVar12 >> 0x18) ^ (byte)(uVar8 >> 0x18)) >> 7,
                                uVar11 - (uVar16 - 1),uVar13 << ((byte)(uVar16 - 1) & 0x1f),status);
    return fVar6;
  }
  if (((uVar12 & 0x7fffff) == 0) && (uVar20 == 0 || uVar11 != 0xff)) {
LAB_0055b322:
    status->float_exception_flags = status->float_exception_flags | 1;
    return 0x7fc00000;
  }
LAB_0055b261:
  fVar6 = propagateFloat32NaN(fVar6,b,status);
  return fVar6;
}

Assistant:

float32 float32_rem(float32 a, float32 b, float_status *status)
{
    flag aSign, zSign;
    int aExp, bExp, expDiff;
    uint32_t aSig, bSig;
    uint32_t q;
    uint64_t aSig64, bSig64, q64;
    uint32_t alternateASig;
    int32_t sigMean;
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );
    bSig = extractFloat32Frac( b );
    bExp = extractFloat32Exp( b );
    if ( aExp == 0xFF ) {
        if ( aSig || ( ( bExp == 0xFF ) && bSig ) ) {
            return propagateFloat32NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return float32_default_nan(status);
    }
    if ( bExp == 0xFF ) {
        if (bSig) {
            return propagateFloat32NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            float_raise(float_flag_invalid, status);
            return float32_default_nan(status);
        }
        normalizeFloat32Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return a;
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
    }
    expDiff = aExp - bExp;
    aSig |= 0x00800000;
    bSig |= 0x00800000;
    if ( expDiff < 32 ) {
        aSig <<= 8;
        bSig <<= 8;
        if ( expDiff < 0 ) {
            if ( expDiff < -1 ) return a;
            aSig >>= 1;
        }
        q = ( bSig <= aSig );
        if ( q ) aSig -= bSig;
        if ( 0 < expDiff ) {
            q = ( ( (uint64_t) aSig )<<32 ) / bSig;
            q >>= 32 - expDiff;
            bSig >>= 2;
            aSig = ( ( aSig>>1 )<<( expDiff - 1 ) ) - bSig * q;
        }
        else {
            aSig >>= 2;
            bSig >>= 2;
        }
    }
    else {
        if ( bSig <= aSig ) aSig -= bSig;
        aSig64 = ( (uint64_t) aSig )<<40;
        bSig64 = ( (uint64_t) bSig )<<40;
        expDiff -= 64;
        while ( 0 < expDiff ) {
            q64 = estimateDiv128To64( aSig64, 0, bSig64 );
            q64 = ( 2 < q64 ) ? q64 - 2 : 0;
#ifdef _MSC_VER
            aSig64 = 0ULL - ( ( bSig * q64 )<<38 );
#else
            aSig64 = - ( ( bSig * q64 )<<38 );
#endif
            expDiff -= 62;
        }
        expDiff += 64;
        q64 = estimateDiv128To64( aSig64, 0, bSig64 );
        q64 = ( 2 < q64 ) ? q64 - 2 : 0;
        q = q64>>( 64 - expDiff );
        bSig <<= 6;
        aSig = ( ( aSig64>>33 )<<( expDiff - 1 ) ) - bSig * q;
    }
    do {
        alternateASig = aSig;
        ++q;
        aSig -= bSig;
    } while ( 0 <= (int32_t) aSig );
    sigMean = aSig + alternateASig;
    if ( ( sigMean < 0 ) || ( ( sigMean == 0 ) && ( q & 1 ) ) ) {
        aSig = alternateASig;
    }
    zSign = ( (int32_t) aSig < 0 );
#ifdef _MSC_VER
    if ( zSign ) aSig = 0ULL - aSig;
#else
    if ( zSign ) aSig = - aSig;
#endif
    return normalizeRoundAndPackFloat32(aSign ^ zSign, bExp, aSig, status);
}